

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O2

void __thiscall
Statsd::StatsdClient::setConfig
          (StatsdClient *this,string *host,uint16_t port,string *prefix,uint64_t batchsize,
          uint64_t sendInterval,int gaugePrecision)

{
  UDPSender *this_00;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)prefix);
  detail::sanitizePrefix(&local_50,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (UDPSender *)operator_new(0xf0);
  UDPSender::UDPSender(this_00,host,port,batchsize,sendInterval);
  std::__uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>::reset
            ((__uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_> *)
             &this->m_sender,this_00);
  this->m_gaugePrecision = gaugePrecision;
  return;
}

Assistant:

inline void StatsdClient::setConfig(const std::string& host,
                                    const uint16_t port,
                                    const std::string& prefix,
                                    const uint64_t batchsize,
                                    const uint64_t sendInterval,
                                    const int gaugePrecision) noexcept {
    m_prefix = detail::sanitizePrefix(prefix);
    m_sender.reset(new UDPSender(host, port, batchsize, sendInterval));
    m_gaugePrecision = gaugePrecision;
}